

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_wString __thiscall
ON_SubDEdgeSharpness::ToPercentageText(ON_SubDEdgeSharpness *this,double sharpness)

{
  bool bVar1;
  wchar_t *pwVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_wString format;
  ON_wString local_30;
  
  if ((sharpness < 0.0) || (4.0 < sharpness)) {
    if ((sharpness != 5.0) || (NAN(sharpness))) {
      ON_wString::ON_wString((ON_wString *)this,L'⚠',1);
    }
    else {
      ON_wString::ON_wString((ON_wString *)this,L"crease");
    }
  }
  else {
    dVar6 = sharpness / 4.0;
    dVar9 = 1.0;
    uVar4 = 0;
    do {
      dVar7 = dVar9 * 100.0 * dVar6;
      dVar8 = floor(dVar7);
      uVar5 = -(ulong)(0.5 < dVar7 - dVar8);
      dVar7 = (double)(~uVar5 & (ulong)dVar8 | (ulong)(dVar8 + 1.0) & uVar5) / dVar9;
      bVar1 = false;
      iVar3 = (int)uVar4;
      if ((ABS(dVar6 * -100.0 + dVar7) <= 5e-05) &&
         ((((dVar8 = 1.0 / dVar9, sharpness <= 0.0 || (dVar8 <= dVar7)) &&
           ((dVar8 = 100.0 - dVar8, dVar7 <= dVar8 || (4.0 <= sharpness)))) ||
          (bVar1 = false, dVar7 = dVar8, iVar3 == 4)))) {
        if (iVar3 == 0) {
          ON_wString::FormatToString((wchar_t *)this,dVar7,L"%g%%");
        }
        else {
          ON_wString::FormatToString((wchar_t *)&local_30,L"%%.%df%%%%",uVar4);
          pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_30);
          ON_wString::FormatToString((wchar_t *)this,dVar7,pwVar2);
          ON_wString::~ON_wString(&local_30);
        }
        bVar1 = true;
      }
      if (bVar1) {
        return (ON_wString)(wchar_t *)this;
      }
      uVar4 = (ulong)(iVar3 + 1U);
      dVar9 = dVar9 * 10.0;
    } while (iVar3 + 1U != 5);
    ON_wString::FormatToString((wchar_t *)this,dVar6 * 100.0,L"%g%%");
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubDEdgeSharpness::ToPercentageText(double sharpness)
{
  if ( ON_SubDEdgeSharpness::IsValidValue(sharpness,false) )
  {
    const double s = sharpness / ON_SubDEdgeSharpness::MaximumValue;
    double m = 1.0; 
    unsigned max_decimal_places = 4;
    for (unsigned decimal_places = 0; decimal_places <= max_decimal_places; ++decimal_places, m *= 10.0 )
    {
      double p = 100.0 * m * s;
      double f = floor(p);
      if (p - f > 0.5)
        f = f + 1.0;
      f /= m;
      if (fabs(f - 100.0*s) <= 0.00005)
      {
        double minf = 1.0 / m;
        if (f < minf && sharpness > 0.0)
        {
          if (decimal_places < max_decimal_places)
            continue;          
          f = minf;
        }
        else if (f > 100.0 - minf && sharpness < ON_SubDEdgeSharpness::MaximumValue)
        {
          if (decimal_places < max_decimal_places)
            continue;
          f = 100.0 - minf;
        }
        if (0 == decimal_places)
          return ON_wString::FormatToString(L"%g%%", f);
        const ON_wString format = ON_wString::FormatToString(L"%%.%df%%%%", decimal_places);
        return ON_wString::FormatToString(format, f);
      }
    }
    return ON_wString::FormatToString(L"%g%%", s*100.0);
  }

  if (ON_SubDEdgeSharpness::CreaseValue == sharpness)
    return ON_wString(L"crease");

  return ON_wString(ON_wString::WarningSign);
}